

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CEditorImage_*,_allocator_default<CEditorImage_*>_>::remove_index
          (array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *this,int index)

{
  int iVar1;
  int in_ESI;
  array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *in_RDI;
  int i;
  
  for (iVar1 = in_ESI + 1; iVar1 < in_RDI->num_elements; iVar1 = iVar1 + 1) {
    in_RDI->list[iVar1 + -1] = in_RDI->list[iVar1];
  }
  size(in_RDI);
  set_size((array<CEditorImage_*,_allocator_default<CEditorImage_*>_> *)CONCAT44(in_ESI,iVar1),
           (int)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void remove_index(int index)
	{
		for(int i = index+1; i < num_elements; i++)
			list[i-1] = list[i];

		set_size(size()-1);
	}